

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O1

HighsStatus __thiscall
Highs::changeIntegralityInterface
          (Highs *this,HighsIndexCollection *index_collection,HighsVarType *integrality)

{
  bool bVar1;
  uint uVar2;
  HighsStatus HVar3;
  vector<HighsVarType,_std::allocator<HighsVarType>_> local_integrality;
  allocator_type local_69;
  vector<HighsVarType,_std::allocator<HighsVarType>_> local_68;
  string local_50;
  
  uVar2 = dataSize(index_collection);
  HVar3 = kOk;
  if (0 < (int)uVar2) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"column integrality","");
    bVar1 = highsVarTypeUserDataNotNull
                      (&(this->options_).super_HighsOptionsStruct.log_options,integrality,&local_50)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    HVar3 = kError;
    if (!bVar1) {
      std::vector<HighsVarType,std::allocator<HighsVarType>>::vector<HighsVarType_const*,void>
                ((vector<HighsVarType,std::allocator<HighsVarType>> *)&local_68,integrality,
                 integrality + uVar2,&local_69);
      changeLpIntegrality(&(this->model_).lp_,index_collection,&local_68);
      invalidateModelStatus(this);
      if (local_68.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      HVar3 = kOk;
    }
  }
  return HVar3;
}

Assistant:

HighsStatus Highs::changeIntegralityInterface(
    HighsIndexCollection& index_collection, const HighsVarType* integrality) {
  HighsInt num_integrality = dataSize(index_collection);
  // If a non-positive number of integrality (may) need changing nothing needs
  // to be done
  if (num_integrality <= 0) return HighsStatus::kOk;
  if (highsVarTypeUserDataNotNull(options_.log_options, integrality,
                                  "column integrality"))
    return HighsStatus::kError;
  // Take a copy of the integrality that can be normalised
  std::vector<HighsVarType> local_integrality{integrality,
                                              integrality + num_integrality};
  // If changing the integrality for a set of columns, verify that the
  // set entries are in ascending order
  if (index_collection.is_set_)
    assert(increasingSetOk(index_collection.set_, 0,
                           index_collection.dimension_, true));
  changeLpIntegrality(model_.lp_, index_collection, local_integrality);
  // Deduce the consequences of new integrality
  invalidateModelStatus();
  return HighsStatus::kOk;
}